

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int set_sort(lyxp_set *set,lyd_node *cur_node,int options)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  lyd_node *plVar9;
  lyxp_set_node *plVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  lyxp_set_node *item1;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  lyxp_set_node item;
  lyxp_node_type local_4c;
  undefined8 uStack_48;
  lyxp_node_type root_type;
  lyxp_set_hash_node hnode;
  undefined4 uStack_34;
  
  iVar7 = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (set->used != 1)) {
    plVar9 = moveto_get_root(cur_node,options,&local_4c);
    iVar5 = set_assign_pos(set,plVar9,local_4c);
    iVar7 = -1;
    if (iVar5 == 0) {
      pcVar13 = "SORT BEGIN";
      ly_log_dbg(8,"SORT BEGIN");
      print_set_debug(set);
      uVar6 = set->used;
      uVar12 = 0;
      if (uVar6 != 0) {
        uVar11 = 0;
        unique0x10000408 = plVar9;
LAB_0017575b:
        if (1 < uVar6 - uVar11) {
          bVar4 = false;
          pcVar13 = (char *)CONCAT71((int7)((ulong)pcVar13 >> 8),1);
          pcVar16 = (char *)0x1;
LAB_00175772:
          hnode.node._4_4_ = (uint)pcVar13;
          lVar14 = (long)pcVar16 << 4;
          do {
            item1 = (lyxp_set_node *)((long)&(set->val).nodes[-1].node + lVar14);
            plVar10 = (lyxp_set_node *)((long)&((set->val).nodes)->node + lVar14);
            if (bVar4) {
              iVar7 = set_sort_compare(plVar10,item1,stack0xffffffffffffffc8);
              if (iVar7 < 0) goto LAB_001757de;
            }
            else {
              iVar7 = set_sort_compare(item1,plVar10,stack0xffffffffffffffc8);
              if (0 < iVar7) goto LAB_001757de;
            }
            bVar4 = !bVar4;
            pcVar16 = pcVar16 + 1;
            uVar6 = set->used;
            pcVar13 = (char *)(ulong)(uVar6 - uVar11);
            lVar14 = lVar14 + 0x10;
            if (pcVar13 <= pcVar16) {
              uVar12 = uVar11 + 1;
              if ((hnode.node._4_4_ & 1) != 0) goto LAB_0017583d;
              goto LAB_00175831;
            }
          } while( true );
        }
        uVar12 = uVar11 + 1;
      }
LAB_0017583d:
      stack0xffffffffffffffc8 = (lyd_node *)CONCAT44(uStack_34,uVar12);
      ly_log_dbg(8,"SORT END %d");
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (hash_table *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x604,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
        }
        lVar14 = 8;
        uVar15 = 0;
        do {
          uStack_48 = *(undefined8 *)((long)(set->val).nodes + lVar14 + -8);
          hnode.node._0_4_ = *(undefined4 *)((long)&((set->val).nodes)->node + lVar14);
          uVar8 = dict_hash_multi(0,(char *)&stack0xffffffffffffffb8,8);
          uVar8 = dict_hash_multi(uVar8,(char *)&hnode,4);
          uVar8 = dict_hash_multi(uVar8,(char *)0x0,0);
          iVar7 = lyht_find(set->ht,&stack0xffffffffffffffb8,uVar8,(void **)0x0);
          if (iVar7 != 0) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x60d,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
          }
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar15 < set->used);
      }
      iVar7 = hnode.type - LYXP_NODE_ROOT_CONFIG;
    }
  }
  return iVar7;
LAB_001757de:
  pcVar13 = pcVar16 + -1;
  plVar10 = (set->val).nodes;
  plVar9 = plVar10[(long)pcVar13].node;
  uVar2 = *(undefined8 *)&plVar10[(long)pcVar13].type;
  puVar1 = (undefined8 *)((long)&plVar10->node + lVar14);
  uVar3 = puVar1[1];
  plVar10 = plVar10 + (long)pcVar13;
  plVar10->node = (lyd_node *)*puVar1;
  plVar10->type = (int)uVar3;
  plVar10->pos = (int)((ulong)uVar3 >> 0x20);
  puVar1 = (undefined8 *)((long)&((set->val).nodes)->node + lVar14);
  *puVar1 = plVar9;
  puVar1[1] = uVar2;
  pcVar16 = pcVar16 + 1;
  uVar6 = set->used;
  pcVar13 = (char *)0x0;
  if ((char *)(ulong)(uVar6 - uVar11) <= pcVar16) goto LAB_00175831;
  goto LAB_00175772;
LAB_00175831:
  uVar11 = uVar11 + 1;
  uVar12 = uVar11;
  if (uVar6 <= uVar11) goto LAB_0017583d;
  goto LAB_0017575b;
}

Assistant:

static int
set_sort(struct lyxp_set *set, const struct lyd_node *cur_node, int options)
{
    uint32_t i, j;
    int ret = 0, cmp, inverted, change;
    const struct lyd_node *root;
    enum lyxp_node_type root_type;
    struct lyxp_set_node item;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used == 1)) {
        return 0;
    }

    /* get root */
    root = moveto_get_root(cur_node, options, &root_type);

    /* fill positions */
    if (set_assign_pos(set, root, root_type)) {
        return -1;
    }

    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1], root);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j], root);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);

#ifdef LY_ENABLED_CACHE
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    /* check node hashes */
    if (set->used >= LY_CACHE_HT_MIN_CHILDREN) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = dict_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }
#endif

    return ret - 1;
}